

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_sse4.c
# Opt level: O0

void cdef_copy_rect8_8bit_to_16bit_sse4_1
               (uint16_t *dst,int dstride,uint8_t *src,int sstride,int width,int height)

{
  undefined8 uVar1;
  int local_d4;
  int local_d0;
  v64 row;
  int i;
  int j;
  int height_local;
  int width_local;
  int sstride_local;
  uint8_t *src_local;
  int dstride_local;
  uint16_t *dst_local;
  byte local_18;
  undefined1 uStack_17;
  undefined1 uStack_16;
  undefined1 uStack_15;
  byte bStack_14;
  undefined1 uStack_13;
  undefined1 uStack_12;
  undefined1 uStack_11;
  
  for (local_d4 = 0; local_d4 < height; local_d4 = local_d4 + 1) {
    for (local_d0 = 0; local_d0 < (int)(width & 0xfffffff8U); local_d0 = local_d0 + 8) {
      uVar1 = *(undefined8 *)(src + (local_d4 * sstride + local_d0));
      local_18 = (byte)uVar1;
      uStack_17 = (undefined1)((ulong)uVar1 >> 8);
      uStack_16 = (undefined1)((ulong)uVar1 >> 0x10);
      uStack_15 = (undefined1)((ulong)uVar1 >> 0x18);
      bStack_14 = (byte)((ulong)uVar1 >> 0x20);
      uStack_13 = (undefined1)((ulong)uVar1 >> 0x28);
      uStack_12 = (undefined1)((ulong)uVar1 >> 0x30);
      uStack_11 = (undefined1)((ulong)uVar1 >> 0x38);
      *(ulong *)(dst + (local_d4 * dstride + local_d0)) =
           (ulong)CONCAT16(uStack_15,
                           (uint6)CONCAT14(uStack_16,(uint)CONCAT12(uStack_17,(ushort)local_18)));
      *(ulong *)((long)(dst + (local_d4 * dstride + local_d0)) + 8) =
           (ulong)CONCAT16(uStack_11,
                           (uint6)CONCAT14(uStack_12,(uint)CONCAT12(uStack_13,(ushort)bStack_14)));
    }
    for (; local_d0 < width; local_d0 = local_d0 + 1) {
      dst[local_d4 * dstride + local_d0] = (ushort)src[local_d4 * sstride + local_d0];
    }
  }
  return;
}

Assistant:

void cdef_copy_rect8_8bit_to_16bit_sse4_1(uint16_t *dst, int dstride,
                                          const uint8_t *src, int sstride,
                                          int width, int height) {
  int j = 0;
  for (int i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v64 row = v64_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], v128_unpack_u8_s16(row));
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}